

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_deviation(lyout *out,int level,lys_module *module,lys_deviation *deviation)

{
  int level_00;
  int level_01;
  char *value;
  bool bVar1;
  char *str;
  uint local_30;
  int p;
  int j;
  int i;
  lys_deviation *deviation_local;
  lys_module *module_local;
  int level_local;
  lyout *out_local;
  
  value = transform_json2schema(module,deviation->target_name);
  ly_print(out,"%*sdeviation \"%s\" {\n",(ulong)(uint)(level << 1));
  lydict_remove(module->ctx,value);
  level_00 = level + 1;
  if (deviation->ext_size != '\0') {
    yang_print_extension_instances
              (out,level_00,module,LYEXT_SUBSTMT_SELF,'\0',deviation->ext,(uint)deviation->ext_size)
    ;
  }
  yang_print_substmt(out,level_00,LYEXT_SUBSTMT_DESCRIPTION,'\0',deviation->dsc,module,
                     deviation->ext,(uint)deviation->ext_size);
  yang_print_substmt(out,level_00,LYEXT_SUBSTMT_REFERENCE,'\0',deviation->ref,module,deviation->ext,
                     (uint)deviation->ext_size);
  p = 0;
  do {
    if ((int)(uint)deviation->deviate_size <= p) {
      ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
      return;
    }
    ly_print(out,"%*sdeviate ",(ulong)(uint)(level_00 * 2),"");
    if (deviation->deviate[p].mod == LY_DEVIATE_NO) {
      if (deviation->deviate[p].ext_size != '\0') {
        ly_print(out,"not-supported {\n");
        goto LAB_001c9508;
      }
      ly_print(out,"not-supported;\n");
    }
    else {
      if (deviation->deviate[p].mod == LY_DEVIATE_ADD) {
        ly_print(out,"add {\n");
      }
      else if (deviation->deviate[p].mod == LY_DEVIATE_RPL) {
        ly_print(out,"replace {\n");
      }
      else if (deviation->deviate[p].mod == LY_DEVIATE_DEL) {
        ly_print(out,"delete {\n");
      }
LAB_001c9508:
      level_01 = level + 2;
      if (deviation->deviate[p].ext_size != '\0') {
        yang_print_extension_instances
                  (out,level_01,module,LYEXT_SUBSTMT_SELF,'\0',deviation->deviate[p].ext,
                   (uint)deviation->deviate[p].ext_size);
      }
      if (deviation->deviate[p].type != (lys_type *)0x0) {
        yang_print_type(out,level_01,module,deviation->deviate[p].type);
      }
      yang_print_substmt(out,level_01,LYEXT_SUBSTMT_UNITS,'\0',deviation->deviate[p].units,module,
                         deviation->deviate[p].ext,(uint)deviation->deviate[p].ext_size);
      for (local_30 = 0; (int)local_30 < (int)(uint)deviation->deviate[p].must_size;
          local_30 = local_30 + 1) {
        yang_print_must(out,level_01,module,deviation->deviate[p].must + (int)local_30);
      }
      for (local_30 = 0; (int)local_30 < (int)(uint)deviation->deviate[p].unique_size;
          local_30 = local_30 + 1) {
        yang_print_unique(out,level_01,module,deviation->deviate[p].unique + (int)local_30);
        str._4_4_ = -1;
        do {
          str._4_4_ = lys_ext_iter(deviation->deviate[p].ext,deviation->deviate[p].ext_size,
                                   (char)str._4_4_ + '\x01',LYEXT_SUBSTMT_UNIQUE);
          bVar1 = false;
          if (str._4_4_ != -1) {
            bVar1 = deviation->deviate[p].ext[str._4_4_]->insubstmt_index != local_30;
          }
        } while (bVar1);
        if (str._4_4_ == -1) {
          ly_print(out,";\n");
        }
        else {
          ly_print(out," {\n");
          do {
            yang_print_extension_instances
                      (out,level + 3,module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)local_30,
                       deviation->deviate[p].ext + str._4_4_,1);
            do {
              str._4_4_ = lys_ext_iter(deviation->deviate[p].ext,deviation->deviate[p].ext_size,
                                       (char)str._4_4_ + '\x01',LYEXT_SUBSTMT_UNIQUE);
              bVar1 = false;
              if (str._4_4_ != -1) {
                bVar1 = deviation->deviate[p].ext[str._4_4_]->insubstmt_index != local_30;
              }
            } while (bVar1);
          } while (str._4_4_ != -1);
          ly_print(out,"%*s}\n",(ulong)(uint)(level_01 * 2),"");
        }
      }
      for (local_30 = 0; (int)local_30 < (int)(uint)deviation->deviate[p].dflt_size;
          local_30 = local_30 + 1) {
        yang_print_substmt(out,level_01,LYEXT_SUBSTMT_DEFAULT,(uint8_t)local_30,
                           deviation->deviate[p].dflt[(int)local_30],module,
                           deviation->deviate[p].ext,(uint)deviation->deviate[p].ext_size);
      }
      if ((deviation->deviate[p].flags & 1) == 0) {
        if ((deviation->deviate[p].flags & 2) != 0) {
          yang_print_substmt(out,level_01,LYEXT_SUBSTMT_CONFIG,'\0',"false",module,
                             deviation->deviate->ext,(uint)deviation->deviate[p].ext_size);
        }
      }
      else {
        yang_print_substmt(out,level_01,LYEXT_SUBSTMT_CONFIG,'\0',"true",module,
                           deviation->deviate->ext,(uint)deviation->deviate[p].ext_size);
      }
      if ((deviation->deviate[p].flags & 0x40) == 0) {
        if ((deviation->deviate[p].flags & 0x80) != 0) {
          yang_print_substmt(out,level_01,LYEXT_SUBSTMT_MANDATORY,'\0',"false",module,
                             deviation->deviate[p].ext,(uint)deviation->deviate[p].ext_size);
        }
      }
      else {
        yang_print_substmt(out,level_01,LYEXT_SUBSTMT_MANDATORY,'\0',"true",module,
                           deviation->deviate[p].ext,(uint)deviation->deviate[p].ext_size);
      }
      if (deviation->deviate[p].min_set != '\0') {
        yang_print_unsigned(out,level_01,LYEXT_SUBSTMT_MIN,'\0',module,deviation->deviate[p].ext,
                            (uint)deviation->deviate[p].ext_size,deviation->deviate[p].min);
      }
      if (deviation->deviate[p].max_set != '\0') {
        if (deviation->deviate[p].max == 0) {
          yang_print_substmt(out,level_01,LYEXT_SUBSTMT_MAX,'\0',"unbounded",module,
                             deviation->deviate[p].ext,(uint)deviation->deviate[p].ext_size);
        }
        else {
          yang_print_unsigned(out,level_01,LYEXT_SUBSTMT_MAX,'\0',module,deviation->deviate[p].ext,
                              (uint)deviation->deviate[p].ext_size,deviation->deviate[p].max);
        }
      }
      ly_print(out,"%*s}\n",(ulong)(uint)(level_00 * 2),"");
    }
    p = p + 1;
  } while( true );
}

Assistant:

static void
yang_print_deviation(struct lyout *out, int level, const struct lys_module *module,
                     const struct lys_deviation *deviation)
{
    int i, j, p;
    const char *str;

    str = transform_json2schema(module, deviation->target_name);
    ly_print(out, "%*sdeviation \"%s\" {\n", LEVEL, INDENT, str);
    lydict_remove(module->ctx, str);
    level++;

    if (deviation->ext_size) {
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, deviation->ext, deviation->ext_size);
    }
    yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, deviation->dsc,
                       module, deviation->ext, deviation->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, deviation->ref,
                       module, deviation->ext, deviation->ext_size);

    for (i = 0; i < deviation->deviate_size; ++i) {
        ly_print(out, "%*sdeviate ", LEVEL, INDENT);
        if (deviation->deviate[i].mod == LY_DEVIATE_NO) {
            if (deviation->deviate[i].ext_size) {
                ly_print(out, "not-supported {\n");
            } else {
                ly_print(out, "not-supported;\n");
                continue;
            }
        } else if (deviation->deviate[i].mod == LY_DEVIATE_ADD) {
            ly_print(out, "add {\n");
        } else if (deviation->deviate[i].mod == LY_DEVIATE_RPL) {
            ly_print(out, "replace {\n");
        } else if (deviation->deviate[i].mod == LY_DEVIATE_DEL) {
            ly_print(out, "delete {\n");
        }
        level++;

        /* extensions */
        if (deviation->deviate[i].ext_size) {
            yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                           deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        }

        /* type */
        if (deviation->deviate[i].type) {
            yang_print_type(out, level, module, deviation->deviate[i].type);
        }

        /* units */
        yang_print_substmt(out, level, LYEXT_SUBSTMT_UNITS, 0, deviation->deviate[i].units, module,
                           deviation->deviate[i].ext, deviation->deviate[i].ext_size);

        /* must */
        for (j = 0; j < deviation->deviate[i].must_size; ++j) {
            yang_print_must(out, level, module, &deviation->deviate[i].must[j]);
        }

        /* unique */

        for (j = 0; j < deviation->deviate[i].unique_size; ++j) {
            yang_print_unique(out, level, module, &deviation->deviate[i].unique[j]);
            /* unique's extensions */
            p = -1;
            do {
                p = lys_ext_iter(deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                      p + 1, LYEXT_SUBSTMT_UNIQUE);
            } while (p != -1 && deviation->deviate[i].ext[p]->insubstmt_index != j);
            if (p != -1) {
                ly_print(out, " {\n");
                do {
                    yang_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_UNIQUE, j,
                                                   &deviation->deviate[i].ext[p], 1);
                    do {
                        p = lys_ext_iter(deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                              p + 1, LYEXT_SUBSTMT_UNIQUE);
                    } while (p != -1 && deviation->deviate[i].ext[p]->insubstmt_index != j);
                } while (p != -1);
                ly_print(out, "%*s}\n", LEVEL, INDENT);
            } else {
                ly_print(out, ";\n");
            }
        }

        /* default */
        for (j = 0; j < deviation->deviate[i].dflt_size; ++j) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, j, deviation->deviate[i].dflt[j], module,
                               deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        }

        /* config */
        if (deviation->deviate[i].flags & LYS_CONFIG_W) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true", module,
                               deviation->deviate->ext, deviation->deviate[i].ext_size);
        } else if (deviation->deviate[i].flags & LYS_CONFIG_R) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false", module,
                               deviation->deviate->ext, deviation->deviate[i].ext_size);
        }

        /* mandatory */
        if (deviation->deviate[i].flags & LYS_MAND_TRUE) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true", module,
                               deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        } else if (deviation->deviate[i].flags & LYS_MAND_FALSE) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false", module,
                               deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        }

        /* min-elements */
        if (deviation->deviate[i].min_set) {
            yang_print_unsigned(out, level, LYEXT_SUBSTMT_MIN, 0, module,
                                deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                deviation->deviate[i].min);
        }

        /* max-elements */
        if (deviation->deviate[i].max_set) {
            if (deviation->deviate[i].max) {
                yang_print_unsigned(out, level, LYEXT_SUBSTMT_MAX, 0, module,
                                    deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                    deviation->deviate[i].max);
            } else {
                yang_print_substmt(out, level, LYEXT_SUBSTMT_MAX, 0, "unbounded", module,
                                   deviation->deviate[i].ext, deviation->deviate[i].ext_size);
            }
        }

        level--;
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    }

    level--;
    ly_print(out, "%*s}\n", LEVEL, INDENT);
}